

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_http_request.cc
# Opt level: O1

int __thiscall AliHttpRequest::CommitRequest(AliHttpRequest *this)

{
  _Rb_tree_header *p_Var1;
  string *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  int iVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  _Base_ptr p_Var8;
  AliTlsConnection *this_00;
  long lVar9;
  AliTcpConnection *this_01;
  int iVar10;
  _Alloc_hider _Var11;
  _Self __tmp;
  bool bVar12;
  string path;
  string req;
  string host;
  string local_110;
  key_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d0;
  long local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  string local_b0;
  long *local_90 [2];
  long local_80 [2];
  string local_70;
  key_type local_50;
  
  iVar5 = std::__cxx11::string::compare((char *)&this->method_);
  if (iVar5 == 0) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Content-Length","");
    iVar6 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&(this->map_request_headers_)._M_t,&local_50);
    if ((_Rb_tree_header *)iVar6._M_node !=
        &(this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header) goto LAB_001304d8;
    bVar12 = (this->query_)._M_string_length != 0;
  }
  else {
LAB_001304d8:
    bVar12 = false;
  }
  if ((iVar5 == 0) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2)) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (bVar12 != false) {
    get_format_string_abi_cxx11_(&local_110,"%d",(this->query_)._M_string_length);
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"Content-Length","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->map_request_headers_,&local_f0);
    std::__cxx11::string::operator=((string *)pmVar7,(string *)&local_110);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    paVar3 = &local_110.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    local_110._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,"Content-Type","");
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->map_request_headers_,&local_110);
    std::__cxx11::string::_M_replace((ulong)pmVar7,0,(char *)pmVar7->_M_string_length,0x176658);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != paVar3) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
  }
  GetPath_abi_cxx11_(&local_110,this,(bool)(bVar12 ^ 1));
  get_format_string_abi_cxx11_
            (&local_f0,"%s %s HTTP/1.1\r\n",(this->method_)._M_dataplus._M_p,
             local_110._M_dataplus._M_p);
  p_Var8 = (this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->map_request_headers_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var1) {
    do {
      append_format_string
                (&local_f0,"%s: %s\r\n",*(undefined8 *)(p_Var8 + 1),*(undefined8 *)(p_Var8 + 2));
      p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var1);
  }
  std::__cxx11::string::append((char *)&local_f0);
  if (this->is_tls == true) {
    this_00 = (AliTlsConnection *)operator_new(0xb08);
    pcVar4 = (this->host_)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar4,pcVar4 + (this->host_)._M_string_length);
    iVar5 = atoi((this->port_)._M_dataplus._M_p);
    AliTlsConnection::AliTlsConnection(this_00,&local_70,iVar5);
    this->connection_ = (AliConnection *)this_00;
    local_c0._M_allocated_capacity = local_70.field_2._M_allocated_capacity;
    _Var11._M_p = local_70._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) goto LAB_0013088c;
  }
  else {
    local_d0 = &local_c0;
    pcVar4 = (this->host_)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_d0,pcVar4,pcVar4 + (this->host_)._M_string_length);
    iVar5 = atoi((this->port_)._M_dataplus._M_p);
    if ((this->proxy_host_)._M_string_length != 0) {
      psVar2 = &this->proxy_host_;
      lVar9 = std::__cxx11::string::find((char *)psVar2,0x1766a1,0);
      if (lVar9 == -1) {
        iVar5 = 0x50;
        std::__cxx11::string::_M_assign((string *)&local_d0);
      }
      else {
        std::__cxx11::string::substr((ulong)local_90,(ulong)psVar2);
        std::__cxx11::string::operator=((string *)&local_d0,(string *)local_90);
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
        std::__cxx11::string::substr((ulong)local_90,(ulong)psVar2);
        iVar5 = atoi((char *)local_90[0]);
        if (local_90[0] != local_80) {
          operator_delete(local_90[0],local_80[0] + 1);
        }
      }
    }
    this_01 = (AliTcpConnection *)operator_new(0x38);
    local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_b0,local_d0,local_d0->_M_local_buf + local_c8);
    AliTcpConnection::AliTcpConnection(this_01,&local_b0,iVar5);
    this->connection_ = (AliConnection *)this_01;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    _Var11._M_p = (pointer)local_d0;
    if (local_d0 == &local_c0) goto LAB_0013088c;
  }
  operator_delete(_Var11._M_p,local_c0._M_allocated_capacity + 1);
LAB_0013088c:
  iVar5 = (**this->connection_->_vptr_AliConnection)();
  iVar10 = -1;
  if (((iVar5 == 0) &&
      (iVar5 = (*this->connection_->_vptr_AliConnection[1])
                         (this->connection_,local_f0._M_dataplus._M_p,
                          (ulong)(uint)local_f0._M_string_length), 0 < iVar5)) &&
     ((iVar5 = std::__cxx11::string::compare((char *)&this->method_), iVar5 != 0 ||
      (((this->query_)._M_string_length == 0 ||
       (iVar5 = (*this->connection_->_vptr_AliConnection[1])
                          (this->connection_,(this->query_)._M_dataplus._M_p), 0 < iVar5)))))) {
    iVar10 = 0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
  }
  return iVar10;
}

Assistant:

int AliHttpRequest::CommitRequest() {
  bool with_query = true;  

  // if content-length is not setted, we assume no body
  // put the query into body,and add Content-Type header
  if(this->method_ == "POST" 
     && this->map_request_headers_.find("Content-Length") == this->map_request_headers_.end()
     && this->query_.size() > 0) {
    with_query = false;
    this->map_request_headers_["Content-Length"] = get_format_string("%d", this->query_.size());
    this->map_request_headers_["Content-Type"] = "application/x-www-form-urlencoded";
  }
  std::string path = GetPath(with_query); 

  std::string req = get_format_string("%s %s HTTP/1.1\r\n", this->method_.c_str(),  path.c_str());
  for(std::map<std::string, std::string>::iterator it = map_request_headers_.begin();
      it != map_request_headers_.end(); it++) {
    append_format_string(req, "%s: %s\r\n", it->first.c_str(), it->second.c_str());
  }
  req.append("\r\n");

  ALI_LOG("request=\n%s", req.c_str());

  if(this->is_tls) {
    connection_ = new AliTlsConnection(this->host_, atoi(this->port_.c_str()));
  } else {
    std::string host = this->host_;
    int port = atoi(this->port_.c_str());
    if(!this->proxy_host_.empty()) {
        size_t pos = this->proxy_host_.find(":");
        if(pos == std::string::npos) {
          host = this->proxy_host_;
          port = 80;
        } else {
          host = this->proxy_host_.substr(0, pos);
          port = atoi(this->proxy_host_.substr(pos + 1, this->proxy_host_.size() - pos - 1).c_str());
        }
    }
    ALI_LOG("host=%s,port=%d", host.c_str(), port);
    connection_ = new AliTcpConnection(host, port);
  }

  if(connection_->Connect() != 0) {
    return -1;
  }

  if(connection_->Send((char*)req.c_str(), req.size()) <= 0) {
    return -1;
  }
  if(this->method_ == "POST" && this->query_.size() > 0) {
     if(connection_->Send((char*)this->query_.c_str(), this->query_.size()) <= 0) {
      return -1;
    }
  }
  return 0;
}